

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

void __thiscall
GlobOpt::PreLowerCanonicalize(GlobOpt *this,Instr *instr,Value **pSrc1Val,Value **pSrc2Val)

{
  Opnd *pOVar1;
  Opnd *this_00;
  Opnd *this_01;
  RegOpnd *dst;
  Value *pVVar2;
  code *pcVar3;
  OpndKind OVar4;
  bool bVar5;
  uint uVar6;
  Instr *instr_00;
  undefined4 *puVar7;
  uint uVar8;
  ulong uVar9;
  OpCode OVar10;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_34;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32;
  
  pOVar1 = instr->m_dst;
  this_00 = instr->m_src1;
  this_01 = instr->m_src2;
  OVar4 = IR::Opnd::GetKind(this_00);
  if ((((OVar4 != OpndKindIntConst) &&
       (OVar4 = IR::Opnd::GetKind(this_00), OVar4 != OpndKindInt64Const)) &&
      (OVar4 = IR::Opnd::GetKind(this_00), OVar4 != OpndKindAddr)) &&
     (OVar4 = IR::Opnd::GetKind(this_00), OVar4 != OpndKindHelperCall)) {
    if (pOVar1 == (Opnd *)0x0 || this_01 == (Opnd *)0x0) {
      return;
    }
    OVar4 = IR::Opnd::GetKind(this_01);
    if (OVar4 != OpndKindReg) {
      return;
    }
    if (((((this_01->field_0xb & 4) == 0) || ((this_00->field_0xb & 4) != 0)) ||
        (bVar5 = IR::Opnd::IsEqual(this_00,pOVar1), bVar5)) &&
       (bVar5 = IR::Opnd::IsEqual(this_01,pOVar1), !bVar5)) {
      return;
    }
    bVar5 = OpCodeAttr::OpndHasImplicitCall(instr->m_opcode);
    if (bVar5) {
      if (instr->m_kind == InstrKindBranch) {
        local_34 = (this_00->m_valueType).field_0;
        bVar5 = ValueType::IsPrimitive((ValueType *)&local_34.field_0);
        if (!bVar5) {
          return;
        }
      }
      else {
        local_34 = (this_00->m_valueType).field_0;
        bVar5 = ValueType::IsPrimitive((ValueType *)&local_34.field_0);
        if (bVar5) goto LAB_0044cd17;
      }
      local_32 = (this_01->m_valueType).field_0;
      bVar5 = ValueType::IsPrimitive((ValueType *)&local_32.field_0);
      if (!bVar5) {
        return;
      }
    }
  }
LAB_0044cd17:
  OVar10 = instr->m_opcode;
  uVar6 = (uint)OVar10;
  if (BrOnNoEnvProperty < OVar10) {
    if (OVar10 < FromVar) {
      switch(OVar10) {
      case BrNotEq_A:
      case BrSrNotEq_A:
      case BrSrNotNeq_A:
      case BrEq_I4:
      case BrNeq_I4:
      case Add_I4:
      case Mul_I4:
      case And_I4:
      case Or_I4:
      case Xor_I4:
        break;
      case BrNotNeq_A:
        goto switchD_0044ce05_caseD_195;
      case BrNotGe_A:
        OVar10 = BrNotLe_A;
        break;
      case BrNotGt_A:
        OVar10 = BrNotLt_A;
        break;
      case BrNotLt_A:
        OVar10 = BrNotGt_A;
        break;
      case BrNotLe_A:
        OVar10 = BrNotGe_A;
        break;
      default:
        goto switchD_0044ce05_caseD_19c;
      case BrGe_I4:
        OVar10 = BrLe_I4;
        break;
      case BrGt_I4:
        OVar10 = BrLt_I4;
        break;
      case BrLt_I4:
        OVar10 = BrGt_I4;
        break;
      case BrLe_I4:
        OVar10 = BrGe_I4;
        break;
      case CallDirect:
      case Neg_I4:
      case Not_I4:
      case Sub_I4:
        goto switchD_0044ce05_caseD_1bb;
      }
      goto switchD_0044ce05_caseD_194;
    }
    if (OVar10 < NewScopeSlotsWithoutPropIds) {
      uVar6 = OVar10 - 0x1de;
      if (uVar6 < 0x40) {
        if ((0xc0000001062f80e7U >> ((ulong)uVar6 & 0x3f) & 1) != 0) {
          return;
        }
        if ((ulong)uVar6 == 0x37) goto switchD_0044ce50_caseD_1f;
      }
    }
    else if (uVar6 == 0x26e || OVar10 < InlineRegExpExec) {
      uVar6 = uVar6 - 0x21f;
      if (uVar6 < 0x30) {
        uVar9 = 0xda000006e0a1;
        goto LAB_0044cd60;
      }
    }
    else {
      if (OVar10 - 0x28b < 4) {
        return;
      }
      if (uVar6 == 0x26f) goto switchD_0044ce50_caseD_1f;
      if (uVar6 == 0x277) {
        return;
      }
    }
    goto switchD_0044ce05_caseD_19c;
  }
  if (ProfiledLdRootMethodFld < OVar10) {
    if (OVar10 < NewScObjectSpread) {
      uVar8 = OVar10 - 0xbe;
      if (uVar8 < 0x40) {
        if ((0x800000300b5b8003U >> ((ulong)uVar8 & 0x3f) & 1) != 0) {
          return;
        }
        if ((0xa40UL >> ((ulong)uVar8 & 0x3f) & 1) != 0) goto switchD_0044ce50_caseD_1f;
      }
      uVar6 = uVar6 - 0x70;
      if (uVar6 < 0x2d) {
        uVar9 = 0x140000004405;
LAB_0044cd60:
        if ((uVar9 >> ((ulong)uVar6 & 0x3f) & 1) != 0) {
          return;
        }
      }
    }
    else {
      if (OVar10 - 0x173 < 2) {
        return;
      }
      if (uVar6 == 0x160) goto switchD_0044ce50_caseD_1f;
      if (OVar10 == 0x169) {
        return;
      }
    }
    goto switchD_0044ce05_caseD_19c;
  }
  switch(OVar10) {
  case StartCall:
  case BrNotHasSideEffects:
  case Ret:
    goto switchD_0044ce05_caseD_1bb;
  case Break:
  case Br:
  case BrFncNeqApply:
  case BrFalse_A:
  case BrTrue_A:
  case BrOnHasLocalProperty:
  case BrOnHasLocalEnvProperty:
  case BrOnObject_A:
  case BrNotNull_A:
  case BrOnNotNullObj_A:
  case EndSwitch:
  case Case:
  case BeginSwitch:
  case ProfiledBeginSwitch:
  case CallIFlags:
  case CallIExtended:
  case CallIExtendedFlags:
  case Throw:
    goto switchD_0044ce05_caseD_19c;
  case BrEq_A:
switchD_0044ce05_caseD_195:
    bVar5 = IR::Opnd::IsImmediateOpnd(this_00);
    if (!bVar5) {
      local_34 = (this_00->m_valueType).field_0;
      bVar5 = ValueType::IsPrimitive((ValueType *)&local_34.field_0);
      if (!bVar5) {
        return;
      }
      local_32 = (this_01->m_valueType).field_0;
      bVar5 = ValueType::IsPrimitive((ValueType *)&local_32.field_0);
LAB_0044ce8c:
      if (bVar5 == false) {
        return;
      }
    }
    break;
  case BrNeq_A:
  case BrSrEq_A:
  case BrSrNeq_A:
    break;
  case BrGe_A:
    OVar10 = BrLe_A;
    break;
  case BrGt_A:
    OVar10 = BrLt_A;
    break;
  case BrLt_A:
    OVar10 = BrGt_A;
    break;
  case BrLe_A:
    OVar10 = BrGe_A;
    break;
  case CallI:
switchD_0044ce50_caseD_1f:
    bVar5 = IR::Instr::HasFixedFunctionAddressTarget(instr);
    if (bVar5) {
      return;
    }
    goto switchD_0044ce05_caseD_19c;
  default:
    switch(OVar10) {
    case Add_A:
      OVar10 = Add_A;
      if (1 < (byte)(this_00->m_type - TyFloat32)) {
        return;
      }
      break;
    case Div_A:
    case ProfiledDiv_A:
    case Rem_A:
    case ProfiledRem_A:
    case Sub_A:
    case Expo_A:
    case Shl_A:
    case Shr_A:
    case ShrU_A:
    case CmSrEq_A:
    case CmSrNeq_A:
    case Conv_Num:
    case Conv_Obj:
      goto switchD_0044ce05_caseD_19c;
    case Mul_A:
    case And_A:
    case Or_A:
    case Xor_A:
      break;
    case CmEq_A:
    case CmNeq_A:
      goto switchD_0044ce05_caseD_195;
    case CmGe_A:
      bVar5 = IR::Opnd::IsImmediateOpnd(this_00);
      if (bVar5) {
        OVar10 = CmLe_A;
        break;
      }
      local_34 = (this_00->m_valueType).field_0;
      bVar5 = ValueType::IsPrimitive((ValueType *)&local_34.field_0);
      if (!bVar5) {
        return;
      }
      local_32 = (this_01->m_valueType).field_0;
      bVar5 = ValueType::IsPrimitive((ValueType *)&local_32.field_0);
      OVar10 = CmLe_A;
      goto LAB_0044ce8c;
    case CmGt_A:
      bVar5 = IR::Opnd::IsImmediateOpnd(this_00);
      if (!bVar5) {
        local_34 = (this_00->m_valueType).field_0;
        bVar5 = ValueType::IsPrimitive((ValueType *)&local_34.field_0);
        if (!bVar5) {
          return;
        }
        local_32 = (this_01->m_valueType).field_0;
        bVar5 = ValueType::IsPrimitive((ValueType *)&local_32.field_0);
        OVar10 = CmLt_A;
        goto LAB_0044ce8c;
      }
      OVar10 = CmLt_A;
      break;
    case CmLt_A:
      bVar5 = IR::Opnd::IsImmediateOpnd(this_00);
      if (!bVar5) {
        local_34 = (this_00->m_valueType).field_0;
        bVar5 = ValueType::IsPrimitive((ValueType *)&local_34.field_0);
        if (!bVar5) {
          return;
        }
        local_32 = (this_01->m_valueType).field_0;
        bVar5 = ValueType::IsPrimitive((ValueType *)&local_32.field_0);
        OVar10 = CmGt_A;
        goto LAB_0044ce8c;
      }
      OVar10 = CmGt_A;
      break;
    case CmLe_A:
      bVar5 = IR::Opnd::IsImmediateOpnd(this_00);
      if (!bVar5) {
        local_34 = (this_00->m_valueType).field_0;
        bVar5 = ValueType::IsPrimitive((ValueType *)&local_34.field_0);
        if (!bVar5) {
          return;
        }
        local_32 = (this_01->m_valueType).field_0;
        bVar5 = ValueType::IsPrimitive((ValueType *)&local_32.field_0);
        OVar10 = CmGe_A;
        goto LAB_0044ce8c;
      }
      OVar10 = CmGe_A;
      break;
    case Ld_A:
      goto switchD_0044ce05_caseD_1bb;
    default:
      if (OVar10 == ArgOut_A) {
        return;
      }
      goto switchD_0044ce05_caseD_19c;
    }
  }
switchD_0044ce05_caseD_194:
  pOVar1 = instr->m_src2;
  OVar4 = IR::Opnd::GetKind(pOVar1);
  if (((OVar4 == OpndKindIntConst) ||
      (OVar4 = IR::Opnd::GetKind(pOVar1), OVar4 == OpndKindInt64Const)) ||
     ((OVar4 = IR::Opnd::GetKind(pOVar1), OVar4 == OpndKindAddr ||
      (OVar4 = IR::Opnd::GetKind(pOVar1), OVar4 == OpndKindHelperCall)))) {
switchD_0044ce05_caseD_19c:
    OVar4 = IR::Opnd::GetKind(this_00);
    if ((((OVar4 != OpndKindIntConst) &&
         (OVar4 = IR::Opnd::GetKind(this_00), OVar4 != OpndKindInt64Const)) &&
        (OVar4 = IR::Opnd::GetKind(this_00), OVar4 != OpndKindAddr)) &&
       (OVar4 = IR::Opnd::GetKind(this_00), OVar4 != OpndKindHelperCall)) {
      return;
    }
    OVar4 = IR::Opnd::GetKind(this_00);
    if (OVar4 == OpndKindIntConst) {
      instr_00 = IR::Instr::HoistSrc1(instr,Ld_I4,RegNOREG,(StackSym *)0x0);
      dst = (RegOpnd *)instr_00->m_dst;
      OVar4 = IR::Opnd::GetKind((Opnd *)dst);
      if (OVar4 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar5) goto LAB_0044d339;
        *puVar7 = 0;
      }
      ToInt32Dst(this,instr_00,dst,this->currentBlock);
    }
    else {
      OVar4 = IR::Opnd::GetKind(this_00);
      if (OVar4 == OpndKindInt64Const) {
        OVar10 = Ld_I4;
      }
      else {
        OVar10 = Ld_A;
      }
      IR::Instr::HoistSrc1(instr,OVar10,RegNOREG,(StackSym *)0x0);
    }
    pOVar1 = instr->m_src1;
    OVar4 = IR::Opnd::GetKind(pOVar1);
    if (OVar4 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar5) {
LAB_0044d339:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar7 = 0;
    }
    StackSym::SetIsConst((StackSym *)pOVar1[1]._vptr_Opnd);
  }
  else {
    instr->m_opcode = OVar10;
    IR::Instr::SwapOpnds(instr);
    pVVar2 = *pSrc1Val;
    *pSrc1Val = *pSrc2Val;
    *pSrc2Val = pVVar2;
  }
switchD_0044ce05_caseD_1bb:
  return;
}

Assistant:

void
GlobOpt::PreLowerCanonicalize(IR::Instr *instr, Value **pSrc1Val, Value **pSrc2Val)
{
    IR::Opnd *dst = instr->GetDst();
    IR::Opnd *src1 = instr->GetSrc1();
    IR::Opnd *src2 = instr->GetSrc2();

    if (src1->IsImmediateOpnd())
    {
        // Swap for dst, src
    }
    else if (src2 && dst && src2->IsRegOpnd())
    {
        if (src2->GetIsDead() && !src1->GetIsDead() && !src1->IsEqual(dst))
        {
            // Swap if src2 is dead, as the reg can be reuse for the dst for opEqs like on x86 (ADD r1, r2)
        }
        else if (src2->IsEqual(dst))
        {
            // Helps lowering of opEqs
        }
        else
        {
            return;
        }
        // Make sure we don't swap 2 srcs with valueOf calls.
        if (OpCodeAttr::OpndHasImplicitCall(instr->m_opcode))
        {
            if (instr->IsBranchInstr())
            {
                if (!src1->GetValueType().IsPrimitive() || !src2->GetValueType().IsPrimitive())
                {
                    return;
                }
            }
            else if (!src1->GetValueType().IsPrimitive() && !src2->GetValueType().IsPrimitive())
            {
                return;
            }
        }
    }
    else
    {
        return;
    }
    Js::OpCode opcode = instr->m_opcode;
    switch (opcode)
    {
    case Js::OpCode::And_A:
    case Js::OpCode::Mul_A:
    case Js::OpCode::Or_A:
    case Js::OpCode::Xor_A:
    case Js::OpCode::And_I4:
    case Js::OpCode::Mul_I4:
    case Js::OpCode::Or_I4:
    case Js::OpCode::Xor_I4:
    case Js::OpCode::Add_I4:
swap_srcs:
        if (!instr->GetSrc2()->IsImmediateOpnd())
        {
            instr->m_opcode = opcode;
            instr->SwapOpnds();

            Value *tempVal = *pSrc1Val;
            *pSrc1Val = *pSrc2Val;
            *pSrc2Val = tempVal;
            return;
        }
        break;

    case Js::OpCode::BrSrEq_A:
    case Js::OpCode::BrSrNotNeq_A:
    case Js::OpCode::BrEq_I4:
        goto swap_srcs;

    case Js::OpCode::BrSrNeq_A:
    case Js::OpCode::BrNeq_A:
    case Js::OpCode::BrSrNotEq_A:
    case Js::OpCode::BrNotEq_A:
    case Js::OpCode::BrNeq_I4:
        goto swap_srcs;

    case Js::OpCode::BrGe_A:
        opcode = Js::OpCode::BrLe_A;
        goto swap_srcs;

    case Js::OpCode::BrNotGe_A:
        opcode = Js::OpCode::BrNotLe_A;
        goto swap_srcs;

    case Js::OpCode::BrGe_I4:
        opcode = Js::OpCode::BrLe_I4;
        goto swap_srcs;

    case Js::OpCode::BrGt_A:
        opcode = Js::OpCode::BrLt_A;
        goto swap_srcs;

    case Js::OpCode::BrNotGt_A:
        opcode = Js::OpCode::BrNotLt_A;
        goto swap_srcs;

    case Js::OpCode::BrGt_I4:
        opcode = Js::OpCode::BrLt_I4;
        goto swap_srcs;

    case Js::OpCode::BrLe_A:
        opcode = Js::OpCode::BrGe_A;
        goto swap_srcs;

    case Js::OpCode::BrNotLe_A:
        opcode = Js::OpCode::BrNotGe_A;
        goto swap_srcs;

    case Js::OpCode::BrLe_I4:
        opcode = Js::OpCode::BrGe_I4;
        goto swap_srcs;

    case Js::OpCode::BrLt_A:
        opcode = Js::OpCode::BrGt_A;
        goto swap_srcs;

    case Js::OpCode::BrNotLt_A:
        opcode = Js::OpCode::BrNotGt_A;
        goto swap_srcs;

    case Js::OpCode::BrLt_I4:
        opcode = Js::OpCode::BrGt_I4;
        goto swap_srcs;

    case Js::OpCode::BrEq_A:
    case Js::OpCode::BrNotNeq_A:
    case Js::OpCode::CmEq_A:
    case Js::OpCode::CmNeq_A:
        // this == "" not the same as "" == this...
        if (!src1->IsImmediateOpnd() && (!src1->GetValueType().IsPrimitive() || !src2->GetValueType().IsPrimitive()))
        {
            return;
        }
        goto swap_srcs;

    case Js::OpCode::CmGe_A:
        if (!src1->IsImmediateOpnd() && (!src1->GetValueType().IsPrimitive() || !src2->GetValueType().IsPrimitive()))
        {
            return;
        }
        opcode = Js::OpCode::CmLe_A;
        goto swap_srcs;

    case Js::OpCode::CmGt_A:
        if (!src1->IsImmediateOpnd() && (!src1->GetValueType().IsPrimitive() || !src2->GetValueType().IsPrimitive()))
        {
            return;
        }
        opcode = Js::OpCode::CmLt_A;
        goto swap_srcs;

    case Js::OpCode::CmLe_A:
        if (!src1->IsImmediateOpnd() && (!src1->GetValueType().IsPrimitive() || !src2->GetValueType().IsPrimitive()))
        {
            return;
        }
        opcode = Js::OpCode::CmGe_A;
        goto swap_srcs;

    case Js::OpCode::CmLt_A:
        if (!src1->IsImmediateOpnd() && (!src1->GetValueType().IsPrimitive() || !src2->GetValueType().IsPrimitive()))
        {
            return;
        }
        opcode = Js::OpCode::CmGt_A;
        goto swap_srcs;

    case Js::OpCode::CallI:
    case Js::OpCode::CallIFixed:
    case Js::OpCode::NewScObject:
    case Js::OpCode::NewScObjectSpread:
    case Js::OpCode::NewScObjArray:
    case Js::OpCode::NewScObjArraySpread:
    case Js::OpCode::NewScObjectNoCtor:
        // Don't insert load to register if the function operand is a fixed function.
        if (instr->HasFixedFunctionAddressTarget())
        {
            return;
        }
        break;

        // Can't do add because <32 + "Hello"> isn't equal to <"Hello" + 32>
        // Lower can do the swap. Other op-codes listed below don't need immediate source hoisting, as the fast paths handle it,
        // or the lowering handles the hoisting.
    case Js::OpCode::Add_A:
        if (src1->IsFloat())
        {
            goto swap_srcs;
        }
        return;

    case Js::OpCode::Sub_I4:
    case Js::OpCode::Neg_I4:
    case Js::OpCode::Not_I4:
    case Js::OpCode::NewScFunc:
    case Js::OpCode::NewScGenFunc:
    case Js::OpCode::NewScFuncHomeObj:
    case Js::OpCode::NewScGenFuncHomeObj:
    case Js::OpCode::NewScArray:
    case Js::OpCode::NewScIntArray:
    case Js::OpCode::NewScFltArray:
    case Js::OpCode::NewScArrayWithMissingValues:
    case Js::OpCode::NewRegEx:
    case Js::OpCode::Ld_A:
    case Js::OpCode::Ld_I4:
    case Js::OpCode::ThrowRuntimeError:
    case Js::OpCode::TrapIfMinIntOverNegOne:
    case Js::OpCode::TrapIfTruncOverflow:
    case Js::OpCode::TrapIfZero:
    case Js::OpCode::TrapIfUnalignedAccess:
    case Js::OpCode::FromVar:
    case Js::OpCode::Conv_Prim:
    case Js::OpCode::Conv_Prim_Sat:
    case Js::OpCode::LdC_A_I4:
    case Js::OpCode::LdStr:
    case Js::OpCode::InitFld:
    case Js::OpCode::InitRootFld:
    case Js::OpCode::StartCall:
    case Js::OpCode::ArgOut_A:
    case Js::OpCode::ArgOut_A_Inline:
    case Js::OpCode::ArgOut_A_Dynamic:
    case Js::OpCode::ArgOut_A_FromStackArgs:
    case Js::OpCode::ArgOut_A_InlineBuiltIn:
    case Js::OpCode::ArgOut_A_InlineSpecialized:
    case Js::OpCode::ArgOut_A_SpreadArg:
    case Js::OpCode::InlineeEnd:
    case Js::OpCode::EndCallForPolymorphicInlinee:
    case Js::OpCode::InlineeMetaArg:
    case Js::OpCode::InlineBuiltInEnd:
    case Js::OpCode::InlineNonTrackingBuiltInEnd:
    case Js::OpCode::CallHelper:
    case Js::OpCode::LdElemUndef:
    case Js::OpCode::LdElemUndefScoped:
    case Js::OpCode::RuntimeTypeError:
    case Js::OpCode::RuntimeReferenceError:
    case Js::OpCode::Ret:
    case Js::OpCode::NewScObjectSimple:
    case Js::OpCode::NewScObjectLiteral:
    case Js::OpCode::StFld:
    case Js::OpCode::StRootFld:
    case Js::OpCode::StSlot:
    case Js::OpCode::StSlotChkUndecl:
    case Js::OpCode::StElemC:
    case Js::OpCode::StArrSegElemC:
    case Js::OpCode::StElemI_A:
    case Js::OpCode::StElemI_A_Strict:
    case Js::OpCode::CallDirect:
    case Js::OpCode::BrNotHasSideEffects:
    case Js::OpCode::NewConcatStrMulti:
    case Js::OpCode::NewConcatStrMultiBE:
    case Js::OpCode::ExtendArg_A:
    case Js::OpCode::NewScopeSlots:
    case Js::OpCode::NewScopeSlotsWithoutPropIds:
    case Js::OpCode::NewStackScopeSlots:
    case Js::OpCode::IsInst:
    case Js::OpCode::BailOnEqual:
    case Js::OpCode::BailOnNotEqual:
    case Js::OpCode::StArrViewElem:
        return;
    }

    if (!src1->IsImmediateOpnd())
    {
        return;
    }

    // The fast paths or lowering of the remaining instructions may not support handling immediate opnds for the first src. The
    // immediate src1 is hoisted here into a separate instruction.
    if (src1->IsIntConstOpnd())
    {
        IR::Instr *newInstr = instr->HoistSrc1(Js::OpCode::Ld_I4);
        ToInt32Dst(newInstr, newInstr->GetDst()->AsRegOpnd(), this->currentBlock);
    }
    else if (src1->IsInt64ConstOpnd())
    {
        instr->HoistSrc1(Js::OpCode::Ld_I4);
    }
    else
    {
        instr->HoistSrc1(Js::OpCode::Ld_A);
    }
    src1 = instr->GetSrc1();
    src1->AsRegOpnd()->m_sym->SetIsConst();
}